

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O2

void emit_rmro(ASMState *as,x86Op xo,Reg rr,Reg rb,int32_t ofs)

{
  MCode *pMVar1;
  byte *pbVar2;
  uint uVar3;
  byte bVar4;
  char cVar5;
  int iVar6;
  
  pMVar1 = as->mcp;
  if ((char)rb < '\0') {
    *(int32_t *)(pMVar1 + -4) = ofs;
    pMVar1[-5] = '%';
    pMVar1 = pMVar1 + -5;
    cVar5 = '\0';
    rb = 4;
  }
  else {
    cVar5 = '\0';
    if (ofs != 0 || (rb & 7) == 5) {
      if ((char)(MCode)ofs == ofs) {
        pMVar1[-1] = (MCode)ofs;
        pMVar1 = pMVar1 + -1;
        cVar5 = '@';
      }
      else {
        *(int32_t *)(pMVar1 + -4) = ofs;
        pMVar1 = pMVar1 + -4;
        cVar5 = -0x80;
      }
    }
    if ((rb & 7) == 4) {
      pMVar1[-1] = '$';
      pMVar1 = pMVar1 + -1;
    }
  }
  pMVar1[-1] = ((byte)rb & 7) + ((byte)rr & 7) * '\b' + cVar5;
  iVar6 = xo << 0x18;
  if (iVar6 == -0x3c000000) {
    *(x86Op *)(pMVar1 + -5) = (rb >> 3 & 1 | rr >> 1 & 4) << 0xd ^ xo;
    pbVar2 = pMVar1 + -5;
  }
  else {
    *(x86Op *)(pMVar1 + -5) = xo;
    pbVar2 = pMVar1 + (iVar6 >> 0x18);
    uVar3 = rb >> 3 & 1 | rr >> 1 & 0x104;
    if (uVar3 != 0) {
      bVar4 = (byte)(rr >> 0x10) | (byte)uVar3 | 0x40;
      if (iVar6 == -0x4000000) {
        *pbVar2 = bVar4;
        bVar4 = (byte)(xo >> 8);
      }
      else if ((xo & 0xffffff) == 0x6600fd) {
        *pbVar2 = bVar4;
        bVar4 = 0x66;
      }
      pbVar2[-1] = bVar4;
      pbVar2 = pbVar2 + -1;
    }
  }
  as->mcp = pbVar2;
  return;
}

Assistant:

static void emit_rmro(ASMState *as, x86Op xo, Reg rr, Reg rb, int32_t ofs)
{
  MCode *p = as->mcp;
  x86Mode mode;
  if (ra_hasreg(rb)) {
    if (LJ_GC64 && rb == RID_RIP) {
      mode = XM_OFS0;
      p -= 4;
      *(int32_t *)p = ofs;
    } else if (ofs == 0 && (rb&7) != RID_EBP) {
      mode = XM_OFS0;
    } else if (checki8(ofs)) {
      *--p = (MCode)ofs;
      mode = XM_OFS8;
    } else {
      p -= 4;
      *(int32_t *)p = ofs;
      mode = XM_OFS32;
    }
    if ((rb&7) == RID_ESP)
      *--p = MODRM(XM_SCALE1, RID_ESP, RID_ESP);
  } else {
    *(int32_t *)(p-4) = ofs;
#if LJ_64
    p[-5] = MODRM(XM_SCALE1, RID_ESP, RID_EBP);
    p -= 5;
    rb = RID_ESP;
#else
    p -= 4;
    rb = RID_EBP;
#endif
    mode = XM_OFS0;
  }
  as->mcp = emit_opm(xo, mode, rr, rb, p, 0);
}